

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int FinalizeTokenProbas(VP8EncProba *proba)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint total;
  uint proba_00;
  uint local_bc;
  ProbaArray (*local_b8) [8];
  uint8_t (*local_a8) [11];
  uint8_t (*local_a0) [11];
  ProbaArray (*local_98) [8];
  StatsArray (*local_90) [8];
  StatsArray (*local_88) [8];
  uint8_t (*local_80) [11];
  uint8_t (*local_78) [11];
  ProbaArray (*local_70) [8];
  StatsArray (*local_68) [8];
  uint8_t (*local_60) [11];
  uint8_t (*local_58) [11];
  
  local_90 = proba->stats;
  local_98 = proba->coeffs;
  local_a0 = (uint8_t (*) [11])VP8CoeffsUpdateProba;
  local_a8 = (uint8_t (*) [11])VP8CoeffsProba0;
  iVar8 = 0;
  local_bc = 0;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    local_70 = local_98;
    local_78 = local_a8;
    local_80 = local_a0;
    local_88 = local_90;
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      local_b8 = local_70;
      local_58 = local_78;
      local_60 = local_80;
      local_68 = local_88;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        for (lVar9 = 0; lVar9 != 0xb; lVar9 = lVar9 + 1) {
          uVar11 = (*local_68)[0][0][lVar9];
          total = uVar11 >> 0x10;
          bVar1 = (*(uint8_t (*) [3] [11])*local_60)[0][lVar9];
          bVar2 = (*(uint8_t (*) [3] [11])*local_58)[0][lVar9];
          uVar11 = uVar11 & 0xffff;
          if (uVar11 == 0) {
            proba_00 = 0xff;
          }
          else {
            proba_00 = 0xff - (uVar11 * 0xff) / total;
          }
          iVar4 = BranchCost(uVar11,total,(uint)bVar2);
          uVar3 = VP8EntropyCost[bVar1];
          iVar5 = BranchCost(uVar11,total,proba_00);
          iVar5 = iVar5 + (uint)VP8EntropyCost[(byte)~bVar1] + 0x800;
          iVar8 = iVar8 + (uint)VP8EntropyCost
                                [(byte)(-(iVar5 < (int)((uint)uVar3 + iVar4)) ^ bVar1)];
          if (iVar5 < (int)((uint)uVar3 + iVar4)) {
            (*local_b8)[0][0][lVar9] = (uint8_t)proba_00;
            local_bc = local_bc | proba_00 != bVar2;
            iVar8 = iVar8 + 0x800;
          }
          else {
            (*local_b8)[0][0][lVar9] = bVar2;
          }
        }
        local_68 = (StatsArray (*) [8])((*local_68)[0] + 1);
        local_60 = local_60 + 1;
        local_58 = local_58 + 1;
        local_b8 = (ProbaArray (*) [8])((*local_b8)[0] + 1);
      }
      local_88 = (StatsArray (*) [8])(*local_88 + 1);
      local_80 = local_80 + 3;
      local_78 = local_78 + 3;
      local_70 = (ProbaArray (*) [8])(*local_70 + 1);
    }
    local_90 = local_90 + 1;
    local_a0 = local_a0 + 0x18;
    local_a8 = local_a8 + 0x18;
    local_98 = local_98 + 1;
  }
  proba->dirty = local_bc;
  return iVar8;
}

Assistant:

static int FinalizeTokenProbas(VP8EncProba* const proba) {
  int has_changed = 0;
  int size = 0;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const proba_t stats = proba->stats[t][b][c][p];
          const int nb = (stats >> 0) & 0xffff;
          const int total = (stats >> 16) & 0xffff;
          const int update_proba = VP8CoeffsUpdateProba[t][b][c][p];
          const int old_p = VP8CoeffsProba0[t][b][c][p];
          const int new_p = CalcTokenProba(nb, total);
          const int old_cost = BranchCost(nb, total, old_p)
                             + VP8BitCost(0, update_proba);
          const int new_cost = BranchCost(nb, total, new_p)
                             + VP8BitCost(1, update_proba)
                             + 8 * 256;
          const int use_new_p = (old_cost > new_cost);
          size += VP8BitCost(use_new_p, update_proba);
          if (use_new_p) {  // only use proba that seem meaningful enough.
            proba->coeffs[t][b][c][p] = new_p;
            has_changed |= (new_p != old_p);
            size += 8 * 256;
          } else {
            proba->coeffs[t][b][c][p] = old_p;
          }
        }
      }
    }
  }
  proba->dirty = has_changed;
  return size;
}